

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

int tommy_tree_delta(tommy_tree_node *root)

{
  tommy_key_t tVar1;
  tommy_key_t tVar2;
  long in_FS_OFFSET;
  
  tVar2 = 0;
  tVar1 = 0;
  if (root->prev != (tommy_node_struct *)0x0) {
    tVar1 = root->prev->key;
  }
  if (root->next != (tommy_node_struct *)0x0) {
    tVar2 = root->next->key;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return tVar1 - tVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int tommy_tree_delta(tommy_tree_node* root)
{
	int left_height = root->prev ? root->prev->key : 0;
	int right_height = root->next ? root->next->key : 0;

	return left_height - right_height;
}